

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::Shortcut(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiContext *g;
  uint flags_00;
  uint flags_01;
  
  flags_01 = flags | 0x800;
  if ((flags & 0x3c00U) != 0) {
    flags_01 = flags;
  }
  if (owner_id + 1 < 2) {
    owner_id = GImGui->CurrentFocusScopeId;
  }
  if (((GImGui->CurrentItemFlags & 0x400) == 0) &&
     (bVar1 = SetShortcutRouting(key_chord,flags_01,owner_id), bVar1)) {
    flags_00 = flags_01 | 0x20;
    if ((flags_01 & 0xf1) != 1) {
      flags_00 = flags_01;
    }
    bVar1 = IsKeyChordPressed(key_chord,flags_00,owner_id);
    if (bVar1) {
      SetKeyOwnersForKeyChord(key_chord & 0xf000,owner_id,0);
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::Shortcut(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    //IMGUI_DEBUG_LOG("Shortcut(%s, flags=%X, owner_id=0x%08X)\n", GetKeyChordName(key_chord, g.TempBuffer.Data, g.TempBuffer.Size), flags, owner_id);

    // When using (owner_id == 0/Any): SetShortcutRouting() will use CurrentFocusScopeId and filter with this, so IsKeyPressed() is fine with he 0/Any.
    if ((flags & ImGuiInputFlags_RouteTypeMask_) == 0)
        flags |= ImGuiInputFlags_RouteFocused;

    // Using 'owner_id == ImGuiKeyOwner_Any/0': auto-assign an owner based on current focus scope (each window has its focus scope by default)
    // Effectively makes Shortcut() always input-owner aware.
    if (owner_id == ImGuiKeyOwner_Any || owner_id == ImGuiKeyOwner_NoOwner)
        owner_id = GetRoutingIdFromOwnerId(owner_id);

    if (g.CurrentItemFlags & ImGuiItemFlags_Disabled)
        return false;

    // Submit route
    if (!SetShortcutRouting(key_chord, flags, owner_id))
        return false;

    // Default repeat behavior for Shortcut()
    // So e.g. pressing Ctrl+W and releasing Ctrl while holding W will not trigger the W shortcut.
    if ((flags & ImGuiInputFlags_Repeat) != 0 && (flags & ImGuiInputFlags_RepeatUntilMask_) == 0)
        flags |= ImGuiInputFlags_RepeatUntilKeyModsChange;

    if (!IsKeyChordPressed(key_chord, flags, owner_id))
        return false;

    // Claim mods during the press
    SetKeyOwnersForKeyChord(key_chord & ImGuiMod_Mask_, owner_id);

    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByShortcut) == 0); // Passing flags not supported by this function!
    return true;
}